

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ryg_dxt.cpp
# Opt level: O0

void ryg_dxt::CompressColorBlock(sU8 *dest,sU32 *src,sInt quality)

{
  sBool sVar1;
  int in_EDX;
  Pixel *in_RSI;
  ushort *in_RDI;
  sInt b;
  sInt g;
  sInt r;
  sU32 mask;
  sU16 max16;
  sU16 min16;
  sInt i;
  sU32 max;
  sU32 min;
  Pixel color [4];
  Pixel dblock [16];
  Pixel *block;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar2;
  Pixel *color_00;
  sU32 local_8c;
  ushort local_88;
  ushort local_86;
  int local_84;
  uint local_80;
  uint local_7c;
  Pixel local_68 [3];
  sU32 in_stack_ffffffffffffffa4;
  sU16 *in_stack_ffffffffffffffa8;
  sU16 *in_stack_ffffffffffffffb0;
  Pixel *in_stack_ffffffffffffffb8;
  Pixel *in_stack_ffffffffffffffc0;
  
  local_80 = in_RSI->v;
  local_7c = local_80;
  for (local_84 = 1; uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20), local_84 < 0x10
      ; local_84 = local_84 + 1) {
    local_7c = sMin<unsigned_int>(local_7c,in_RSI[local_84].v);
    local_80 = sMax<unsigned_int>(local_80,in_RSI[local_84].v);
  }
  if (local_7c == local_80) {
    local_8c = 0xaaaaaaaa;
    local_88 = (ushort)(byte)OMatch5[(long)(int)(uint)(in_RSI->field_0).r * 2] << 0xb |
               (ushort)(byte)OMatch6[(long)(int)(uint)(in_RSI->field_0).g * 2] << 5 |
               (ushort)(byte)OMatch5[(long)(int)(uint)(in_RSI->field_0).b * 2];
    local_86 = (ushort)(byte)OMatch5[(long)(int)(uint)(in_RSI->field_0).r * 2 + 1] << 0xb |
               (ushort)(byte)OMatch6[(long)(int)(uint)(in_RSI->field_0).g * 2 + 1] << 5 |
               (ushort)(byte)OMatch5[(long)(int)(uint)(in_RSI->field_0).b * 2 + 1];
  }
  else {
    color_00 = in_RSI;
    if (in_EDX != 0) {
      DitherBlock(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      color_00 = local_68;
    }
    OptimizeColorsBlock((Pixel *)dblock._0_8_,(sU16 *)color._8_8_,
                        (sU16 *)CONCAT17(color[1].field_0.a,color._0_7_));
    if (local_88 == local_86) {
      local_8c = 0;
    }
    else {
      EvalColors(color_00,(sU16)((uint)uVar2 >> 0x10),(sU16)uVar2);
      local_8c = MatchColorsBlock((Pixel *)dblock._0_8_,(Pixel *)color._8_8_,(sBool)color[1]._3_1_);
    }
    if (in_EDX != 0) {
      in_RSI = local_68;
    }
    uVar2 = (undefined4)((ulong)in_RSI >> 0x20);
    sVar1 = RefineBlock(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
    if (sVar1) {
      if (local_88 == local_86) {
        local_8c = 0;
      }
      else {
        EvalColors(color_00,(sU16)((uint)uVar2 >> 0x10),(sU16)uVar2);
        local_8c = MatchColorsBlock((Pixel *)dblock._0_8_,(Pixel *)color._8_8_,(sBool)color[1]._3_1_
                                   );
      }
    }
  }
  if (local_88 < local_86) {
    sSwap<unsigned_short>(&local_88,&local_86);
    local_8c = local_8c ^ 0x55555555;
  }
  *in_RDI = local_88;
  in_RDI[1] = local_86;
  *(sU32 *)(in_RDI + 2) = local_8c;
  return;
}

Assistant:

static void CompressColorBlock(sU8* dest, const sU32* src, sInt quality) {
  const Pixel* block = (const Pixel*)src;
  Pixel dblock[16], color[4];

  // check if block is constant
  sU32 min, max;
  min = max = block[0].v;

  for (sInt i = 1; i < 16; i++) {
    min = sMin(min, block[i].v);
    max = sMax(max, block[i].v);
  }

  // perform block compression
  sU16 min16, max16;
  sU32 mask;

  if (min != max)  // no constant color
  {
    // first step: compute dithered version for PCA if desired
    if (quality)
      DitherBlock(dblock, block);

    // second step: pca+map along principal axis
    OptimizeColorsBlock(quality ? dblock : block, max16, min16);
    if (max16 != min16) {
      EvalColors(color, max16, min16);
      mask = MatchColorsBlock(block, color, quality != 0);
    } else
      mask = 0;

    // third step: refine
    if (RefineBlock(quality ? dblock : block, max16, min16, mask)) {
      if (max16 != min16) {
        EvalColors(color, max16, min16);
        mask = MatchColorsBlock(block, color, quality != 0);
      } else
        mask = 0;
    }

  } else  // constant color
  {
    sInt r = block[0].r;
    sInt g = block[0].g;
    sInt b = block[0].b;

    mask = 0xaaaaaaaa;
    max16 = (OMatch5[r][0] << 11) | (OMatch6[g][0] << 5) | OMatch5[b][0];
    min16 = (OMatch5[r][1] << 11) | (OMatch6[g][1] << 5) | OMatch5[b][1];
  }

  // write the color block
  if (max16 < min16) {
    sSwap(max16, min16);
    mask ^= 0x55555555;
  }

  ((sU16*)dest)[0] = max16;
  ((sU16*)dest)[1] = min16;
  ((sU32*)dest)[1] = mask;
}